

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcNamedUnit::~IfcNamedUnit(IfcNamedUnit *this)

{
  undefined1 *puVar1;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcNamedUnit_00825348;
  *(undefined ***)&this->field_0x38 = &PTR__IfcNamedUnit_00825370;
  puVar1 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x18;
  if (puVar1 != &this->field_0x28) {
    operator_delete(puVar1,*(long *)&this->field_0x28 + 1);
    return;
  }
  return;
}

Assistant:

IfcNamedUnit() : Object("IfcNamedUnit") {}